

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthCountOnesInCofs(uint *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  memset(pStore,0,(long)nVars * 8);
  if (nVars < 6) {
    if (0 < nVars) {
      uVar5 = (*pTruth >> 2 & 0x11111111) + (*pTruth & 0x11111111);
      uVar5 = (uVar5 >> 4 & 0x3030303) + (uVar5 & 0x3030303);
      uVar5 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      *pStore = (uVar5 >> 0x10) + (uVar5 & 0xff);
      uVar5 = (*pTruth >> 3 & 0x11111111) + (*pTruth >> 1 & 0x11111111);
      uVar5 = (uVar5 >> 4 & 0x3030303) + (uVar5 & 0x3030303);
      uVar5 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[1] = (uVar5 >> 0x10) + (uVar5 & 0xff);
    }
    if (1 < nVars) {
      uVar5 = (*pTruth >> 1 & 0x11111111) + (*pTruth & 0x11111111);
      uVar5 = (uVar5 >> 4 & 0x3030303) + (uVar5 & 0x3030303);
      uVar5 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[2] = (uVar5 >> 0x10) + (uVar5 & 0xff);
      uVar5 = (*pTruth >> 1 & 0x44444444) + (*pTruth & 0x44444444);
      uVar5 = (uVar5 >> 6 & 0x3030303) + (uVar5 >> 2 & 0x3030303);
      uVar5 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[3] = (uVar5 >> 0x10) + (uVar5 & 0xff);
    }
    if (2 < nVars) {
      uVar5 = (*pTruth >> 1 & 0x5050505) + (*pTruth & 0x5050505);
      uVar5 = (uVar5 >> 2 & 0x3030303) + (uVar5 & 0x3030303);
      uVar5 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[4] = (uVar5 >> 0x10) + (uVar5 & 0xff);
      uVar5 = (*pTruth >> 1 & 0x50505050) + (*pTruth & 0x50505050);
      uVar5 = (uVar5 >> 2 & 0x30303030) + (uVar5 & 0x30303030);
      uVar5 = (uVar5 >> 0xc & 0x70007) + (uVar5 >> 4 & 0x70007);
      pStore[5] = (uVar5 >> 0x10) + (uVar5 & 0xff);
    }
    if (3 < nVars) {
      uVar5 = (*pTruth >> 1 & 0x550055) + (*pTruth & 0x550055);
      uVar5 = (uVar5 >> 2 & 0x330033) + (uVar5 & 0x330033);
      uVar5 = (uVar5 >> 4 & 0x70007) + (uVar5 & 0x70007);
      pStore[6] = (uVar5 >> 0x10) + (uVar5 & 0xff);
      uVar5 = (*pTruth >> 1 & 0x55005500) + (*pTruth & 0x55005500);
      uVar5 = (uVar5 >> 2 & 0x33003300) + (uVar5 & 0x33003300);
      uVar5 = (uVar5 >> 4 & 0x7000700) + (uVar5 & 0x7000700);
      pStore[7] = (uVar5 >> 0x18) + (uVar5 >> 8 & 0xff);
    }
    if (nVars == 5) {
      uVar5 = (*pTruth >> 1 & 0x5555) + (*pTruth & 0x5555);
      uVar5 = (uVar5 >> 2 & 0x3333) + (uVar5 & 0x3333);
      uVar5 = (uVar5 >> 4 & 0x707) + (uVar5 & 0x707);
      pStore[8] = (uVar5 >> 8) + (uVar5 & 0xff);
      uVar5 = (*pTruth >> 1 & 0x55550000) + (*pTruth & 0x55550000);
      uVar5 = (uVar5 >> 2 & 0x33330000) + (uVar5 & 0x33330000);
      uVar5 = (uVar5 >> 4 & 0x7070000) + (uVar5 & 0x7070000);
      pStore[9] = (uVar5 >> 8) + (uVar5 & 0xf0000) >> 0x10;
    }
  }
  else {
    if (0 < (int)uVar5) {
      uVar7 = 0;
      do {
        uVar10 = (pTruth[uVar7] >> 1 & 0x55555555) + (pTruth[uVar7] & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        lVar4 = 0;
        piVar16 = pStore + 10;
        do {
          piVar13 = piVar16 + 1;
          if (((uint)uVar7 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            piVar13 = piVar16;
          }
          *piVar13 = *piVar13 + (uVar10 >> 0x10) + (uVar10 & 0xffff);
          piVar16 = piVar16 + 2;
          lVar4 = lVar4 + 1;
        } while ((ulong)(uint)nVars - 5 != lVar4);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
    }
    if (1 < (int)uVar5) {
      iVar11 = *pStore;
      iVar6 = pStore[1];
      iVar12 = pStore[2];
      iVar9 = pStore[3];
      iVar15 = pStore[4];
      iVar8 = pStore[5];
      iVar1 = pStore[6];
      iVar14 = pStore[7];
      iVar3 = pStore[8];
      iVar2 = pStore[9];
      lVar4 = 0;
      do {
        uVar10 = (pTruth[lVar4 * 2 + 1] & 0x55555555) + (pTruth[lVar4 * 2] & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar11 = (uVar10 >> 0x10) + iVar11 + (uVar10 & 0xff);
        *pStore = iVar11;
        uVar10 = (pTruth[lVar4 * 2] >> 1 & 0x55555555) + (pTruth[lVar4 * 2 + 1] >> 1 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar6 = (uVar10 >> 0x10) + iVar6 + (uVar10 & 0xff);
        pStore[1] = iVar6;
        uVar10 = (pTruth[lVar4 * 2] & 0x33333333) + (pTruth[lVar4 * 2 + 1] & 0xf3333333) * 4;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar12 = (uVar10 >> 0x10) + iVar12 + (uVar10 & 0xff);
        pStore[2] = iVar12;
        uVar10 = pTruth[lVar4 * 2 + 1] >> 2 & 0x33333333 | pTruth[lVar4 * 2] & 0xcccccccc;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar9 = (uVar10 >> 0x10) + iVar9 + (uVar10 & 0xff);
        pStore[3] = iVar9;
        uVar10 = (pTruth[lVar4 * 2 + 1] & 0xf0f0f0f) << 4 | pTruth[lVar4 * 2] & 0xf0f0f0f;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar15 = (uVar10 >> 0x10) + iVar15 + (uVar10 & 0xff);
        pStore[4] = iVar15;
        uVar10 = pTruth[lVar4 * 2 + 1] >> 4 & 0xf0f0f0f | pTruth[lVar4 * 2] & 0xf0f0f0f0;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar8 = (uVar10 >> 0x10) + iVar8 + (uVar10 & 0xff);
        pStore[5] = iVar8;
        uVar10 = (pTruth[lVar4 * 2 + 1] & 0xff00ff) << 8 | pTruth[lVar4 * 2] & 0xff00ff;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar1 = (uVar10 >> 0x10) + iVar1 + (uVar10 & 0xff);
        pStore[6] = iVar1;
        uVar10 = pTruth[lVar4 * 2 + 1] >> 8 & 0xff00ff | pTruth[lVar4 * 2] & 0xff00ff00;
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar14 = (uVar10 >> 0x10) + iVar14 + (uVar10 & 0xff);
        pStore[7] = iVar14;
        uVar10 = pTruth[lVar4 * 2 + 1] << 0x10 | (uint)(ushort)pTruth[lVar4 * 2];
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar3 = (uVar10 >> 0x10) + iVar3 + (uVar10 & 0xff);
        pStore[8] = iVar3;
        uVar10 = CONCAT22(*(undefined2 *)((long)pTruth + lVar4 * 8 + 2),
                          *(undefined2 *)((long)pTruth + lVar4 * 8 + 6));
        uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
        uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
        uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
        iVar2 = (uVar10 >> 0x10) + iVar2 + (uVar10 & 0xff);
        lVar4 = lVar4 + 1;
        pStore[9] = iVar2;
      } while ((int)uVar5 / 2 != (int)lVar4);
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Kit_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Kit_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Kit_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Kit_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Kit_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Kit_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Kit_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Kit_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Kit_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Kit_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}